

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

__m256i * y_convolve_4tap_8x2_avx2
                    (uint8_t *src,ptrdiff_t stride,__m256i *coeffs,__m128i *s_64,__m256i *ss_256)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i *palVar3;
  long in_RCX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  __m256i src34;
  __m256i src23;
  __m256i *in_stack_fffffffffffffee8;
  __m256i *in_stack_fffffffffffffef0;
  
  *(undefined8 *)(in_RCX + 0x30) = *(undefined8 *)(in_RDI + in_RSI);
  *(undefined8 *)(in_RCX + 0x38) = 0;
  auVar2 = *(undefined1 (*) [32])(in_RCX + 0x20);
  *(undefined8 *)(in_RCX + 0x20) = *(undefined8 *)(in_RDI + in_RSI * 2);
  *(undefined8 *)(in_RCX + 0x28) = 0;
  auVar1._16_8_ = *(undefined8 *)(in_RCX + 0x20);
  auVar1._0_16_ = *(undefined1 (*) [16])(in_RCX + 0x30);
  auVar1._24_8_ = *(undefined8 *)(in_RCX + 0x28);
  auVar1 = vpunpcklbw_avx2(auVar2,auVar1);
  *(undefined1 (*) [32])(in_R8 + 0x20) = auVar1;
  palVar3 = convolve_4tap_avx2(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  return palVar3;
}

Assistant:

static inline __m256i y_convolve_4tap_8x2_avx2(const uint8_t *const src,
                                               const ptrdiff_t stride,
                                               const __m256i coeffs[2],
                                               __m128i s_64[4],
                                               __m256i ss_256[2]) {
  s_64[3] = _mm_loadl_epi64((__m128i *)(src + stride));
  const __m256i src23 = _mm256_setr_m128i(s_64[2], s_64[3]);
  s_64[2] = _mm_loadl_epi64((__m128i *)(src + 2 * stride));
  const __m256i src34 = _mm256_setr_m128i(s_64[3], s_64[2]);
  ss_256[1] = _mm256_unpacklo_epi8(src23, src34);
  return convolve_4tap_avx2(ss_256, coeffs);
}